

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_impl.hpp
# Opt level: O0

ComponentType dxil_spv::raw_width_to_component_type(RawType type,RawWidth raw_width)

{
  undefined1 local_1d;
  undefined1 local_1b;
  undefined1 local_19;
  RawWidth raw_width_local;
  RawType type_local;
  
  if (raw_width == B8) {
    raw_width_local._3_1_ = 0xff;
  }
  else if (raw_width == B16) {
    local_19 = 8;
    if (type != Float) {
      local_19 = 3;
    }
    raw_width_local._3_1_ = local_19;
  }
  else if (raw_width == B64) {
    local_1b = 10;
    if (type != Float) {
      local_1b = 7;
    }
    raw_width_local._3_1_ = local_1b;
  }
  else {
    local_1d = 9;
    if (type != Float) {
      local_1d = 5;
    }
    raw_width_local._3_1_ = local_1d;
  }
  return raw_width_local._3_1_;
}

Assistant:

static inline DXIL::ComponentType raw_width_to_component_type(RawType type, RawWidth raw_width)
{
	switch (raw_width)
	{
	case RawWidth::B8:
		return DXIL::ComponentType::InternalU8;
	case RawWidth::B16:
		return type == RawType::Float ? DXIL::ComponentType::F16 : DXIL::ComponentType::U16;
	case RawWidth::B64:
		return type == RawType::Float ? DXIL::ComponentType::F64 : DXIL::ComponentType::U64;
	default:
		return type == RawType::Float ? DXIL::ComponentType::F32 : DXIL::ComponentType::U32;
	}
}